

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# playera.cpp
# Opt level: O1

UINT32 __thiscall PlayerA::GetFileSize(PlayerA *this)

{
  UINT32 UVar1;
  
  if (this->_dLoad == (DATA_LOADER *)0x0) {
    UVar1 = 0;
  }
  else {
    UVar1 = DataLoader_GetTotalSize(this->_dLoad);
    if (UVar1 == 0xffffffff) {
      UVar1 = DataLoader_GetSize(this->_dLoad);
      return UVar1;
    }
  }
  return UVar1;
}

Assistant:

UINT32 PlayerA::GetFileSize(void)
{
	if (_dLoad == NULL)
		return 0x00;
	
	UINT32 result = DataLoader_GetTotalSize(_dLoad);
	if (result != (UINT32)-1)
		return result;
	else
		return DataLoader_GetSize(_dLoad);
}